

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# si_function.hpp
# Opt level: O1

double __thiscall
sisl::si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3>::d
          (si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> *this,int component,
          vector *p)

{
  int local_3c;
  double local_38;
  void *local_30 [2];
  transform *local_20;
  vector *local_18;
  
  local_3c = component;
  local_18 = p;
  if (this->_bUseBasisDerivative == true) {
    if (this->_bForceScale == false) {
      if ((this->_mSpaceTransform).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols !=
          (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)
      goto LAB_0010de8a;
      local_20 = &this->_mSpaceTransform;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_30,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                  *)&local_20);
      local_38 = basis_function::
                 convolution_sum_deriv<3,sisl::cartesian_cubic<float>,sisl::tp_linear>
                           ((vector *)local_30,this->_lattice,&local_3c);
    }
    else {
      if ((this->_mSpaceTransform).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols !=
          (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
LAB_0010de8a:
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                      "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                     );
      }
      local_20 = &this->_mSpaceTransform;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_30,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                  *)&local_20);
      local_38 = basis_function::
                 convolution_sum_deriv_h<3,sisl::cartesian_cubic<float>,sisl::tp_linear>
                           ((vector *)local_30,this->_lattice,&local_3c,&this->_dBasisScale);
    }
  }
  else {
    if (this->_d[component] == (cartesian_cubic<float> *)0x0) {
      return 0.0;
    }
    if (this->_bForceScale == false) {
      if ((this->_mSpaceTransform).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols !=
          (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)
      goto LAB_0010de8a;
      local_20 = &this->_mSpaceTransform;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_30,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                  *)&local_20);
      local_38 = __fast_cubic_tp_linear__<float>((vector *)local_30,this->_d[local_3c]);
    }
    else {
      if ((this->_mSpaceTransform).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols !=
          (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)
      goto LAB_0010de8a;
      local_20 = &this->_mSpaceTransform;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_30,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                  *)&local_20);
      local_38 = basis_function::convolution_sum_h<3,sisl::cartesian_cubic<float>,sisl::tp_linear>
                           ((vector *)local_30,this->_d[local_3c],&this->_dBasisScale);
    }
  }
  free(local_30[0]);
  return local_38;
}

Assistant:

virtual const double d(int component, const vector &p) const {
            if(_bUseBasisDerivative && BF::has_derivative()) {
                if(!_bForceScale)
                    return BF::template convolution_sum_deriv<N, L, BF>(
                            _mSpaceTransform*p,
                            (const L*)_lattice,
                            component);
                return BF::template convolution_sum_deriv_h<N, L, BF>(
                        _mSpaceTransform*p,
                        (const L*)_lattice,
                        component,
                        _dBasisScale);

            }
            if(!_d[component]) return 0;
            if(!_bForceScale)
                return BF::template convolution_sum<N, L, BF>(
                            _mSpaceTransform*p,
                            (const L*)_d[component]);
            return BF::template convolution_sum_h<N, L, BF>(
                        _mSpaceTransform*p,
                        (const L*)_d[component],
                        _dBasisScale);

        }